

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall Js::ByteCodeWriter::ArgOutEnv(ByteCodeWriter *this,ArgSlot arg)

{
  code *pcVar1;
  bool bVar2;
  undefined8 in_RAX;
  undefined4 *puVar3;
  undefined8 uStack_28;
  OpLayoutT_ArgNoSrc<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> layout;
  
  uStack_28 = in_RAX;
  CheckOpen(this);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(ArgOut_Env);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x2f4,"(OpCodeAttr::HasMultiSizeLayout(OpCode::ArgOut_Env))",
                                "OpCodeAttr::HasMultiSizeLayout(OpCode::ArgOut_Env)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = TryWriteArgNoSrc<Js::LayoutSizePolicy<(Js::LayoutSize)0>>(this,ArgOut_Env,arg);
  if (!bVar2) {
    bVar2 = TryWriteArgNoSrc<Js::LayoutSizePolicy<(Js::LayoutSize)1>>(this,ArgOut_Env,arg);
    if (!bVar2) {
      uStack_28 = CONCAT26(arg,(undefined6)uStack_28);
      Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,ArgOut_Env,this);
      Data::Write(&this->m_byteCodeData,(void *)((long)&uStack_28 + 6),2);
    }
  }
  return;
}

Assistant:

void ByteCodeWriter::ArgOutEnv(ArgSlot arg)
    {
        CheckOpen();
        Assert(OpCodeAttr::HasMultiSizeLayout(OpCode::ArgOut_Env));

        MULTISIZE_LAYOUT_WRITE(ArgNoSrc, OpCode::ArgOut_Env, arg);
    }